

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void ra_to_uint32_array(roaring_array_t *ra,uint32_t *ans)

{
  uint32_t *out;
  uint8_t uVar1;
  int iVar2;
  uint32_t base;
  array_container_t *cont;
  long lVar3;
  long lVar4;
  
  if (0 < ra->size) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      cont = (array_container_t *)ra->containers[lVar4];
      uVar1 = ra->typecodes[lVar4];
      if (uVar1 == '\x04') {
        uVar1 = *(uint8_t *)&cont->array;
        cont = *(array_container_t **)cont;
      }
      out = ans + lVar3;
      base = (uint)ra->keys[lVar4] << 0x10;
      if (uVar1 == '\x03') {
        iVar2 = run_container_to_uint32_array(out,(run_container_t *)cont,base);
      }
      else if (uVar1 == '\x02') {
        iVar2 = array_container_to_uint32_array(out,cont,base);
      }
      else {
        iVar2 = bitset_container_to_uint32_array(out,(bitset_container_t *)cont,base);
      }
      lVar3 = lVar3 + iVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 < ra->size);
  }
  return;
}

Assistant:

void ra_to_uint32_array(const roaring_array_t *ra, uint32_t *ans) {
    size_t ctr = 0;
    for (int32_t i = 0; i < ra->size; ++i) {
        int num_added = container_to_uint32_array(
            ans + ctr, ra->containers[i], ra->typecodes[i],
            ((uint32_t)ra->keys[i]) << 16);
        ctr += num_added;
    }
}